

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_7e76ab::TLL::AffectsProperty(TLL *this,string *prop)

{
  cmTarget *this_00;
  string *prop_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar1;
  undefined1 local_60 [40];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_38;
  undefined1 local_30;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  undefined1 local_20;
  string *local_18;
  string *prop_local;
  TLL *this_local;
  
  if ((this->EncodeRemoteReference & 1U) != 0) {
    local_18 = prop;
    prop_local = (string *)this;
    pVar1 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->Props,prop);
    prop_00 = local_18;
    local_38._M_cur =
         (__node_type *)
         pVar1.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_30 = pVar1.second;
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this_00 = this->Target;
      local_28._M_cur = local_38._M_cur;
      local_20 = local_30;
      cmMakefile::GetBacktrace((cmMakefile *)local_60);
      std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
                ((optional<cmListFileBacktrace> *)(local_60 + 0x10),(cmListFileBacktrace *)local_60)
      ;
      cmTarget::AppendProperty
                (this_00,prop_00,&this->DirectoryId,
                 (optional<cmListFileBacktrace> *)(local_60 + 0x10),false);
      std::optional<cmListFileBacktrace>::~optional
                ((optional<cmListFileBacktrace> *)(local_60 + 0x10));
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_60);
    }
  }
  return;
}

Assistant:

void TLL::AffectsProperty(std::string const& prop)
{
  if (!this->EncodeRemoteReference) {
    return;
  }
  // Add a wrapper to the expression to tell LookupLinkItem to look up
  // names in the caller's directory.
  if (this->Props.insert(prop).second) {
    this->Target->AppendProperty(prop, this->DirectoryId,
                                 this->Makefile.GetBacktrace());
  }
}